

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

void __thiscall
crnlib::crn_comp::optimize_alpha_endpoints_task(crn_comp *this,uint64 data,void *pData_ptr)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  vector<unsigned_short> *this_00;
  unsigned_short *puVar7;
  long lVar8;
  long lVar9;
  level_details *plVar10;
  endpoint_indices_details *peVar11;
  uint16 i;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int back;
  uchar *puVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  byte bVar21;
  ushort *puVar22;
  byte bVar23;
  int scale;
  uint16 i_2;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  float fVar29;
  ushort local_17a;
  ulong local_178;
  ushort local_16e;
  float local_16c;
  vector<unsigned_int> hist;
  static_huffman_data_model dm;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  symbol_codec codec;
  
  this_00 = *(vector<unsigned_short> **)((long)pData_ptr + 0x18);
  uVar4 = *(ushort *)((long)pData_ptr + 0x10);
  vector<unsigned_short>::resize(this_00,(uint)uVar4,false);
  local_178 = (ulong)uVar4;
  if (data == 0) {
    lVar8 = *pData_ptr;
    vector<unsigned_short>::resize(this_00,(uint)uVar4,false);
    vector<crnlib::optimize_alpha_params::unpacked_endpoint>::vector
              ((vector<crnlib::optimize_alpha_params::unpacked_endpoint> *)&codec,(uint)uVar4);
    vector<unsigned_short>::vector((vector<unsigned_short> *)&dm,(uint)uVar4);
    for (uVar15 = 0; local_178 != uVar15; uVar15 = uVar15 + 1) {
      *(undefined2 *)(codec.m_pDecode_buf + uVar15 * 2) = *(undefined2 *)(lVar8 + uVar15 * 2);
      *(short *)(dm._0_8_ + uVar15 * 2) = (short)uVar15;
    }
    bVar23 = 0;
    bVar21 = 0;
    uVar15 = local_178;
    while (uVar20 = uVar15 - 1, uVar15 != 0) {
      uVar26 = 0;
      uVar13 = 0xffffffff;
      for (uVar24 = 0; uVar15 != uVar24; uVar24 = uVar24 + 1) {
        uVar18 = ((uint)codec.m_pDecode_buf[uVar24 * 2 + 1] - (uint)bVar23) *
                 ((uint)codec.m_pDecode_buf[uVar24 * 2 + 1] - (uint)bVar23) +
                 ((uint)codec.m_pDecode_buf[uVar24 * 2] - (uint)bVar21) *
                 ((uint)codec.m_pDecode_buf[uVar24 * 2] - (uint)bVar21);
        if (uVar18 < uVar13) {
          uVar26 = (uint)uVar24;
          uVar13 = uVar18;
        }
      }
      uVar24 = (ulong)((uVar26 & 0xffff) * 2);
      bVar21 = codec.m_pDecode_buf[uVar24];
      bVar23 = codec.m_pDecode_buf[uVar24 + 1];
      this_00->m_p[*(ushort *)(dm._0_8_ + uVar24)] = (short)local_178 - (short)uVar15;
      *(undefined2 *)(codec.m_pDecode_buf + uVar24) =
           *(undefined2 *)(codec.m_pDecode_buf + uVar20 * 2);
      *(undefined2 *)(dm._0_8_ + uVar24) = *(undefined2 *)(dm._0_8_ + uVar20 * 2);
      uVar15 = uVar20;
    }
    vector<unsigned_short>::~vector((vector<unsigned_short> *)&dm);
    vector<crnlib::optimize_alpha_params::unpacked_endpoint>::~vector
              ((vector<crnlib::optimize_alpha_params::unpacked_endpoint> *)&codec);
    optimize_alpha_selectors(this);
  }
  else {
    puVar7 = this_00->m_p;
    lVar8 = *pData_ptr;
    lVar9 = *(long *)((long)pData_ptr + 8);
    uVar5 = *(ushort *)((long)pData_ptr + 0x12);
    local_16c = *(float *)((long)pData_ptr + 0x14);
    codec.m_pDecode_buf = (uint8 *)0x0;
    codec.m_pDecode_buf_next = (uint8 *)0x0;
    dm.m_total_syms = 0;
    dm._4_4_ = 0;
    dm.m_codes.m_p = (unsigned_short *)0x0;
    local_17a = uVar5;
    vector<unsigned_int>::vector(&hist,(uint)uVar4);
    vector<unsigned_short>::push_back((vector<unsigned_short> *)&codec,&local_17a);
    uVar26 = uVar5 * (uint)local_178;
    for (local_16e = 0; local_16e < (ushort)local_178; local_16e = local_16e + 1) {
      if (local_16e != local_17a) {
        vector<unsigned_short>::push_back((vector<unsigned_short> *)&dm,&local_16e);
        hist.m_p[local_16e] = *(uint *)(lVar9 + (ulong)uVar26 * 4 + (ulong)local_16e * 4);
      }
    }
    fVar29 = local_16c + 1.0;
    local_16c = 0.0;
    while ((uint)dm.m_codes.m_p != 0) {
      uVar26 = (int)codec.m_pDecode_buf_next - 1;
      uVar15 = (ulong)uVar26;
      local_f8 = 0;
      local_100 = 0;
      uVar20 = 0;
      local_108 = 0;
      for (uVar24 = 0; (uint)dm.m_codes.m_p != uVar24; uVar24 = uVar24 + 1) {
        uVar28 = (ulong)*(ushort *)(dm._0_8_ + uVar24 * 2);
        uVar18 = (uint)*(byte *)(lVar8 + uVar28 * 2);
        iVar25 = uVar18 - *(byte *)(lVar8 + (ulong)*(ushort *)codec.m_pDecode_buf * 2);
        bVar21 = *(byte *)(lVar8 + 1 + uVar28 * 2);
        iVar12 = (uint)bVar21 -
                 (uint)*(byte *)(lVar8 + 1 + (ulong)*(ushort *)codec.m_pDecode_buf * 2);
        uVar13 = iVar12 * iVar12 + iVar25 * iVar25;
        if (999 < uVar13) {
          uVar13 = 1000;
        }
        iVar12 = uVar18 - *(byte *)(lVar8 + (ulong)*(ushort *)(codec.m_pDecode_buf + uVar15 * 2) * 2
                                   );
        iVar25 = (uint)bVar21 -
                 (uint)*(byte *)(lVar8 + 1 +
                                (ulong)*(ushort *)(codec.m_pDecode_buf + uVar15 * 2) * 2);
        uVar18 = iVar25 * iVar25 + iVar12 * iVar12;
        if (999 < uVar18) {
          uVar18 = 1000;
        }
        iVar12 = (int)(long)(fVar29 * 1000.0);
        uVar17 = (ulong)(iVar12 - uVar13);
        uVar14 = (ulong)(iVar12 - uVar18);
        uVar19 = uVar14;
        if (uVar14 < uVar17) {
          uVar19 = uVar17;
        }
        uVar19 = (hist.m_p[uVar28] + (int)local_16c) * uVar19;
        if (uVar20 <= uVar19) {
          uVar20 = uVar19 + 1;
          local_108 = uVar24 & 0xffffffff;
          local_100 = uVar14;
          local_f8 = uVar17;
        }
      }
      local_17a = *(ushort *)(dm._0_8_ + (local_108 & 0xffff) * 2);
      local_16c = (float)hist.m_p[local_17a];
      lVar1 = lVar9 + (ulong)(local_17a * (uint)local_178) * 4;
      uVar18 = 0;
      uVar13 = 0;
      puVar22 = (ushort *)codec.m_pDecode_buf;
      for (; 0 < (int)uVar26; uVar26 = uVar26 - 2) {
        uVar18 = uVar18 + *(int *)(lVar1 + (ulong)*puVar22 * 4) * uVar26;
        uVar13 = uVar13 + *(int *)(lVar1 + (ulong)*(ushort *)(codec.m_pDecode_buf + uVar15 * 2) * 4)
                          * uVar26;
        uVar15 = (ulong)((int)uVar15 - 1);
        puVar22 = puVar22 + 1;
      }
      if (local_f8 * uVar18 < local_100 * uVar13 || local_f8 * uVar18 - local_100 * uVar13 == 0) {
        vector<unsigned_short>::push_back((vector<unsigned_short> *)&codec,&local_17a);
      }
      else {
        vector<unsigned_short>::push_front((vector<unsigned_short> *)&codec,&local_17a);
      }
      vector<unsigned_short>::erase
                ((vector<unsigned_short> *)&dm,
                 (unsigned_short *)((ulong)((uint)(ushort)local_108 * 2) + dm._0_8_));
      uVar15 = 0;
      while( true ) {
        uVar26 = (uint)(uVar15 & 0xffff);
        if ((uint)dm.m_codes.m_p <= uVar26) break;
        uVar15 = (ulong)*(ushort *)(dm._0_8_ + (uVar15 & 0xffff) * 2);
        hist.m_p[uVar15] = hist.m_p[uVar15] + *(int *)(lVar1 + uVar15 * 4);
        uVar15 = (ulong)(uVar26 + 1);
      }
    }
    for (uVar15 = 0; local_178 != uVar15; uVar15 = uVar15 + 1) {
      puVar7[*(ushort *)(codec.m_pDecode_buf + uVar15 * 2)] = (unsigned_short)uVar15;
    }
    vector<unsigned_int>::~vector(&hist);
    vector<unsigned_short>::~vector((vector<unsigned_short> *)&dm);
    vector<unsigned_short>::~vector((vector<unsigned_short> *)&codec);
  }
  pack_alpha_endpoints
            (this,(vector<unsigned_char> *)(*(long *)((long)pData_ptr + 0x18) + 0x10),this_00);
  iVar12 = *(int *)(*(long *)((long)pData_ptr + 0x18) + 0x18);
  vector<unsigned_int>::vector(&hist,(uint)local_178);
  bVar2 = this->m_has_comp[1];
  bVar3 = this->m_has_comp[2];
  plVar10 = (this->m_levels).m_p;
  for (uVar15 = 0; uVar15 < (this->m_levels).m_size; uVar15 = uVar15 + 1) {
    uVar26 = plVar10[uVar15].first_block;
    uVar6 = plVar10[uVar15].num_blocks;
    peVar11 = (this->m_endpoint_indices).m_p;
    uVar13 = 0;
    uVar18 = 0;
    for (uVar20 = (ulong)uVar26; uVar20 < uVar6 + uVar26; uVar20 = uVar20 + 1) {
      uVar27 = uVar18;
      if ((bVar2 != false) &&
         (uVar27 = (uint)this_00->m_p[peVar11[uVar20].field_0.field_0.alpha0],
         peVar11[uVar20].reference == '\0')) {
        hist.m_p[((int)(uVar27 - uVar18) >> 0x1f & (uint)local_178) + (uVar27 - uVar18)] =
             hist.m_p[((int)(uVar27 - uVar18) >> 0x1f & (uint)local_178) + (uVar27 - uVar18)] + 1;
      }
      uVar18 = uVar27;
      uVar27 = uVar13;
      if (bVar3 != false) {
        uVar4 = this_00->m_p[peVar11[uVar20].field_0.field_0.alpha1];
        uVar27 = (uint)uVar4;
        if (peVar11[uVar20].reference == '\0') {
          hist.m_p[((int)(uVar4 - uVar13) >> 0x1f & (uint)local_178) + (uVar4 - uVar13)] =
               hist.m_p[((int)(uVar4 - uVar13) >> 0x1f & (uint)local_178) + (uVar4 - uVar13)] + 1;
        }
      }
      uVar13 = uVar27;
    }
  }
  static_huffman_data_model::static_huffman_data_model(&dm);
  static_huffman_data_model::init(&dm,(EVP_PKEY_CTX *)0x1);
  uVar15 = 0;
  puVar16 = (uchar *)0x0;
  if (dm.m_code_sizes.m_size != 0) {
    puVar16 = dm.m_code_sizes.m_p;
  }
  iVar12 = iVar12 << 3;
  for (; (local_178 & 0xffffffff) != uVar15; uVar15 = uVar15 + 1) {
    iVar12 = iVar12 + (uint)puVar16[uVar15] * hist.m_p[uVar15];
  }
  symbol_codec::symbol_codec(&codec);
  symbol_codec::start_encoding(&codec,0x10000);
  codec.m_simulate_encoding = true;
  symbol_codec::encode_transmit_static_huffman_data_model
            (&codec,&dm,false,(static_huffman_data_model *)0x0);
  symbol_codec::stop_encoding(&codec,false);
  *(uint *)(*(long *)((long)pData_ptr + 0x18) + 0x20) = iVar12 + codec.m_total_bits_written;
  crnlib_delete<crnlib::optimize_alpha_params>((optimize_alpha_params *)pData_ptr);
  symbol_codec::~symbol_codec(&codec);
  static_huffman_data_model::~static_huffman_data_model(&dm);
  vector<unsigned_int>::~vector(&hist);
  return;
}

Assistant:

void crn_comp::optimize_alpha_endpoints_task(uint64 data, void* pData_ptr)
    {
        optimize_alpha_params* pParams = reinterpret_cast<optimize_alpha_params*>(pData_ptr);
        crnlib::vector<uint16>& remapping = pParams->pResult->endpoint_remapping;
        uint16 n = pParams->n;
        remapping.resize(n);

        if (data)
        {
            remap_alpha_endpoints(remapping.get_ptr(), pParams->unpacked_endpoints, pParams->hist, n, pParams->selected, pParams->weight);
        }
        else
        {
            sort_alpha_endpoints(remapping, pParams->unpacked_endpoints, n);
            optimize_alpha_selectors();
        }

        pack_alpha_endpoints(pParams->pResult->packed_endpoints, remapping);
        uint total_bits = pParams->pResult->packed_endpoints.size() << 3;

        crnlib::vector<uint> hist(n);
        bool hasAlpha0 = m_has_comp[cAlpha0], hasAlpha1 = m_has_comp[cAlpha1];
        for (uint level = 0; level < m_levels.size(); level++)
        {
            for (uint alpha0_index = 0, alpha1_index = 0, b = m_levels[level].first_block, bEnd = b + m_levels[level].num_blocks; b < bEnd; b++)
            {
                if (hasAlpha0)
                {
                    uint index = remapping[m_endpoint_indices[b].component[cAlpha0]];
                    if (!m_endpoint_indices[b].reference)
                    {
                        int sym = index - alpha0_index;
                        hist[sym < 0 ? sym + n : sym]++;
                    }
                    alpha0_index = index;
                }
                if (hasAlpha1)
                {
                    uint index = remapping[m_endpoint_indices[b].component[cAlpha1]];
                    if (!m_endpoint_indices[b].reference)
                    {
                        int sym = index - alpha1_index;
                        hist[sym < 0 ? sym + n : sym]++;
                    }
                    alpha1_index = index;
                }
            }
        }

        static_huffman_data_model dm;
        dm.init(true, n, hist.get_ptr(), 16);
        const uint8* code_sizes = dm.get_code_sizes();
        for (uint16 s = 0; s < n; s++)
        {
            total_bits += hist[s] * code_sizes[s];
        }

        symbol_codec codec;
        codec.start_encoding(64 * 1024);
        codec.encode_enable_simulation(true);
        codec.encode_transmit_static_huffman_data_model(dm, false);
        codec.stop_encoding(false);
        total_bits += codec.encode_get_total_bits_written();

        pParams->pResult->total_bits = total_bits;

        crnlib_delete(pParams);
    }